

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.hpp
# Opt level: O2

void __thiscall
duckdb::vector<duckdb::BoundCaseCheck,_true>::erase_at
          (vector<duckdb::BoundCaseCheck,_true> *this,idx_t idx)

{
  InternalException *this_00;
  allocator local_41;
  string local_40;
  
  if (idx <= (ulong)((long)(this->
                           super_vector<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>
                           ).
                           super__Vector_base<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->
                           super_vector<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>
                           ).
                           super__Vector_base<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 4)) {
    unsafe_erase_at(this,idx);
    return;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_40,"Can\'t remove offset %d from vector of size %d",&local_41);
  InternalException::InternalException<unsigned_long,unsigned_long>
            (this_00,&local_40,idx,
             (long)(this->
                   super_vector<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>).
                   super__Vector_base<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->
                   super_vector<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>).
                   super__Vector_base<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void erase_at(idx_t idx) { // NOLINT: not using camelcase on purpose here
		if (MemorySafety<SAFE>::ENABLED && idx > original::size()) {
			throw InternalException("Can't remove offset %d from vector of size %d", idx, original::size());
		}
		unsafe_erase_at(idx);
	}